

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O0

void __thiscall sptk::reaper::FdFilter::FilterBuffer(FdFilter *this,int n_input,int *n_output)

{
  int iVar1;
  int iVar2;
  int *in_RDX;
  int in_ESI;
  FdFilter *in_RDI;
  float f_temp;
  int i_1;
  int to_pad;
  int totaln;
  int npass;
  int k;
  int j;
  int i;
  float half;
  float *q;
  float *dp2;
  float *dp1;
  int16_t *p2;
  int16_t *r;
  int16_t *p;
  float local_94;
  float *local_90;
  int local_88;
  int local_80;
  float local_6c;
  int local_68;
  int local_5c;
  int local_54;
  int local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  short *local_30;
  short *local_28;
  short *local_20;
  
  if ((in_RDI->filter_state_ & 1U) != 0) {
    in_RDI->first_out_ = 0;
    in_RDI->to_skip_ = 0;
    in_RDI->left_over_ = 0;
    local_50 = in_RDI->max_input_ + in_RDI->n_filter_coeffs_;
    local_48 = in_RDI->output_delayed_;
    while (local_50 != 0) {
      *local_48 = 0.0;
      local_50 = local_50 + -1;
      local_48 = local_48 + 1;
    }
  }
  local_5c = (in_ESI + in_RDI->left_over_) / in_RDI->fft_size_;
  if ((local_5c == 0) && ((in_RDI->filter_state_ & 2U) != 0)) {
    local_50 = in_ESI;
    local_28 = in_RDI->leftovers_ + in_RDI->left_over_;
    local_20 = in_RDI->input_buffer_;
    while (local_50 != 0) {
      *local_28 = *local_20;
      local_50 = local_50 + -1;
      local_28 = local_28 + 1;
      local_20 = local_20 + 1;
    }
    iVar1 = in_RDI->fft_size_;
    iVar2 = in_RDI->left_over_;
    for (local_68 = 0; local_68 < iVar1 - (iVar2 + in_ESI); local_68 = local_68 + 1) {
      *local_28 = 0;
      local_28 = local_28 + 1;
    }
    local_5c = 1;
  }
  else {
    local_50 = in_RDI->fft_size_ - in_RDI->left_over_;
    local_28 = in_RDI->leftovers_ + in_RDI->left_over_;
    local_20 = in_RDI->input_buffer_;
    while (local_50 != 0) {
      *local_28 = *local_20;
      local_50 = local_50 + -1;
      local_28 = local_28 + 1;
      local_20 = local_20 + 1;
    }
  }
  if ((local_5c == 0) && ((in_RDI->filter_state_ & 2U) == 0)) {
    in_RDI->left_over_ = in_ESI + in_RDI->left_over_;
    *in_RDX = 0;
    in_RDI->first_out_ = in_RDI->filter_state_ & 1U | in_RDI->first_out_;
  }
  else {
    in_RDI->filter_state_ = in_RDI->first_out_ | in_RDI->filter_state_;
    in_RDI->first_out_ = 0;
    local_48 = in_RDI->output_delayed_;
    for (local_50 = 0; local_50 < local_5c; local_50 = local_50 + 1) {
      if (local_50 == 0) {
        local_54 = in_RDI->fft_size_by2_;
        local_40 = in_RDI->y_;
        local_38 = in_RDI->x_;
        local_30 = in_RDI->leftovers_;
        local_28 = in_RDI->leftovers_ + in_RDI->fft_size_by2_;
        while (local_54 != 0) {
          *local_38 = (float)(int)*local_30;
          *local_40 = (float)(int)*local_28;
          local_54 = local_54 + -1;
          local_40 = local_40 + 1;
          local_38 = local_38 + 1;
          local_30 = local_30 + 1;
          local_28 = local_28 + 1;
        }
      }
      else {
        local_54 = in_RDI->fft_size_by2_;
        local_40 = in_RDI->y_;
        local_38 = in_RDI->x_;
        local_28 = local_20 + in_RDI->fft_size_by2_;
        while (local_54 != 0) {
          *local_38 = (float)(int)*local_20;
          *local_40 = (float)(int)*local_28;
          local_54 = local_54 + -1;
          local_40 = local_40 + 1;
          local_38 = local_38 + 1;
          local_28 = local_28 + 1;
          local_20 = local_20 + 1;
        }
        local_20 = local_20 + in_RDI->fft_size_by2_;
      }
      local_54 = in_RDI->fft_size_by2_;
      while (local_54 != 0) {
        *local_40 = 0.0;
        *local_38 = 0.0;
        local_54 = local_54 + -1;
        local_40 = local_40 + 1;
        local_38 = local_38 + 1;
      }
      FFT::fft(in_RDI->fft_,in_RDI->x_,in_RDI->y_);
      ComplexDotProduct(in_RDI,in_RDI->fft_size_,in_RDI->x_,in_RDI->y_,in_RDI->xf_,(float *)0x0,
                        in_RDI->x_,in_RDI->y_);
      FFT::ifft(in_RDI->fft_,in_RDI->x_,in_RDI->y_);
      local_40 = local_48;
      for (local_54 = in_RDI->fft_size_ - in_RDI->n_filter_coeffs_by2_; local_54 < in_RDI->fft_size_
          ; local_54 = local_54 + 1) {
        *local_40 = in_RDI->x_[local_54] + *local_40;
        local_40 = local_40 + 1;
      }
      local_54 = 0;
      iVar1 = in_RDI->n_filter_coeffs_by2_;
      for (; local_54 < iVar1; local_54 = local_54 + 1) {
        *local_40 = in_RDI->x_[local_54] + *local_40;
        local_40 = local_40 + 1;
      }
      iVar1 = in_RDI->fft_size_;
      iVar2 = in_RDI->n_filter_coeffs_by2_;
      for (local_54 = in_RDI->n_filter_coeffs_by2_; local_54 < iVar1 - iVar2;
          local_54 = local_54 + 1) {
        *local_40 = in_RDI->x_[local_54];
        local_40 = local_40 + 1;
      }
      local_40 = local_48 + in_RDI->fft_size_by2_;
      for (local_54 = in_RDI->fft_size_ - in_RDI->n_filter_coeffs_by2_; local_54 < in_RDI->fft_size_
          ; local_54 = local_54 + 1) {
        *local_40 = in_RDI->y_[local_54] + *local_40;
        local_40 = local_40 + 1;
      }
      local_54 = 0;
      iVar1 = in_RDI->n_filter_coeffs_by2_;
      for (; local_54 < iVar1; local_54 = local_54 + 1) {
        *local_40 = in_RDI->y_[local_54] + *local_40;
        local_40 = local_40 + 1;
      }
      iVar1 = in_RDI->fft_size_;
      iVar2 = in_RDI->n_filter_coeffs_by2_;
      for (local_54 = in_RDI->n_filter_coeffs_by2_; local_54 < iVar1 - iVar2;
          local_54 = local_54 + 1) {
        *local_40 = in_RDI->y_[local_54];
        local_40 = local_40 + 1;
      }
      local_48 = local_48 + in_RDI->fft_size_;
    }
    in_RDI->left_over_ = in_ESI - (int)((long)local_20 - (long)in_RDI->input_buffer_ >> 1);
    local_50 = in_RDI->left_over_;
    local_28 = in_RDI->leftovers_;
    while (local_50 != 0) {
      *local_28 = *local_20;
      local_50 = local_50 + -1;
      local_28 = local_28 + 1;
      local_20 = local_20 + 1;
    }
    if ((in_RDI->left_over_ != 0) && ((in_RDI->filter_state_ & 2U) != 0)) {
      local_50 = in_RDI->fft_size_ - in_RDI->left_over_;
      local_30 = in_RDI->leftovers_ + in_RDI->left_over_;
      while (local_50 != 0) {
        *local_30 = 0;
        local_50 = local_50 + -1;
        local_30 = local_30 + 1;
      }
      local_54 = in_RDI->fft_size_by2_;
      local_40 = in_RDI->y_;
      local_38 = in_RDI->x_;
      local_30 = in_RDI->leftovers_;
      local_28 = in_RDI->leftovers_ + in_RDI->fft_size_by2_;
      while (local_54 != 0) {
        *local_38 = (float)(int)*local_30;
        *local_40 = (float)(int)*local_28;
        local_54 = local_54 + -1;
        local_40 = local_40 + 1;
        local_38 = local_38 + 1;
        local_30 = local_30 + 1;
        local_28 = local_28 + 1;
      }
      local_54 = in_RDI->fft_size_by2_;
      while (local_54 != 0) {
        *local_40 = 0.0;
        *local_38 = 0.0;
        local_54 = local_54 + -1;
        local_40 = local_40 + 1;
        local_38 = local_38 + 1;
      }
      FFT::fft(in_RDI->fft_,in_RDI->x_,in_RDI->y_);
      ComplexDotProduct(in_RDI,in_RDI->fft_size_,in_RDI->x_,in_RDI->y_,in_RDI->xf_,(float *)0x0,
                        in_RDI->x_,in_RDI->y_);
      FFT::ifft(in_RDI->fft_,in_RDI->x_,in_RDI->y_);
      local_40 = local_48;
      for (local_54 = in_RDI->fft_size_ - in_RDI->n_filter_coeffs_by2_; local_54 < in_RDI->fft_size_
          ; local_54 = local_54 + 1) {
        *local_40 = in_RDI->x_[local_54] + *local_40;
        local_40 = local_40 + 1;
      }
      local_54 = 0;
      iVar1 = in_RDI->n_filter_coeffs_by2_;
      for (; local_54 < iVar1; local_54 = local_54 + 1) {
        *local_40 = in_RDI->x_[local_54] + *local_40;
        local_40 = local_40 + 1;
      }
      iVar1 = in_RDI->fft_size_;
      iVar2 = in_RDI->n_filter_coeffs_by2_;
      for (local_54 = in_RDI->n_filter_coeffs_by2_; local_54 < iVar1 - iVar2;
          local_54 = local_54 + 1) {
        *local_40 = in_RDI->x_[local_54];
        local_40 = local_40 + 1;
      }
      local_40 = local_48 + in_RDI->fft_size_by2_;
      for (local_54 = in_RDI->fft_size_ - in_RDI->n_filter_coeffs_by2_; local_54 < in_RDI->fft_size_
          ; local_54 = local_54 + 1) {
        *local_40 = in_RDI->y_[local_54] + *local_40;
        local_40 = local_40 + 1;
      }
      local_54 = 0;
      iVar1 = in_RDI->n_filter_coeffs_by2_;
      for (; local_54 < iVar1; local_54 = local_54 + 1) {
        *local_40 = in_RDI->y_[local_54] + *local_40;
        local_40 = local_40 + 1;
      }
      iVar1 = in_RDI->fft_size_;
      iVar2 = in_RDI->n_filter_coeffs_by2_;
      for (local_54 = in_RDI->n_filter_coeffs_by2_; local_54 < iVar1 - iVar2;
          local_54 = local_54 + 1) {
        *local_40 = in_RDI->y_[local_54];
        local_40 = local_40 + 1;
      }
    }
    if ((in_RDI->filter_state_ & 1U) == 0) {
      local_80 = 0;
    }
    else {
      local_80 = in_RDI->n_filter_coeffs_by2_;
    }
    if ((in_RDI->filter_state_ & 2U) == 0) {
      local_88 = 0;
    }
    else {
      local_88 = in_RDI->left_over_ + in_RDI->n_filter_coeffs_by2_;
    }
    local_88 = ((local_5c * in_RDI->fft_size_ - in_RDI->to_skip_) - local_80) + local_88;
    *in_RDX = (local_88 + -1) / in_RDI->decimate_ + 1;
    if ((in_RDI->filter_state_ & 1U) == 0) {
      local_90 = in_RDI->output_delayed_ + in_RDI->to_skip_;
    }
    else {
      local_90 = in_RDI->output_delayed_ + in_RDI->n_filter_coeffs_by2_;
    }
    local_48 = local_90;
    iVar1 = in_RDI->decimate_;
    local_50 = *in_RDX;
    local_20 = in_RDI->output_buffer_;
    while (local_50 != 0) {
      local_6c = *local_48;
      if (32767.0 < local_6c) {
        local_6c = 32767.0;
      }
      if (local_6c < -32768.0) {
        local_6c = -32768.0;
      }
      if (local_6c <= 0.0) {
        local_94 = local_6c - 0.5;
      }
      else {
        local_94 = local_6c + 0.5;
      }
      *local_20 = (int16_t)(int)local_94;
      local_48 = local_48 + iVar1;
      local_50 = local_50 + -1;
      local_20 = local_20 + 1;
    }
    local_54 = in_RDI->n_filter_coeffs_;
    local_40 = in_RDI->output_delayed_;
    local_38 = in_RDI->output_delayed_ + local_5c * in_RDI->fft_size_;
    while (local_54 != 0) {
      *local_40 = *local_38;
      local_54 = local_54 + -1;
      local_40 = local_40 + 1;
      local_38 = local_38 + 1;
    }
    in_RDI->to_skip_ = *in_RDX * in_RDI->decimate_ - local_88;
  }
  return;
}

Assistant:

void FdFilter::FilterBuffer(int n_input, int *n_output) {
  int16_t *p, *r, *p2;
  float *dp1, *dp2, *q, half = 0.5;
  int  i, j, k, npass;
  int totaln;

  if (filter_state_ & 1) {  /* first call with this signal and filter? */
    first_out_ = 0;
    to_skip_ = 0;
    left_over_ = 0;
    for (i = max_input_+n_filter_coeffs_, q = output_delayed_; i--;)
      *q++ = 0.0;
  }    /* end of once-per-filter-invocation initialization */

  npass = (n_input + left_over_) / fft_size_;
  if (!npass && (filter_state_ & 2)) {  // if it's the end...
    // Append the input to the leftovers, then pad with zeros.
    p = input_buffer_;
    for (p = input_buffer_, r = leftovers_ + left_over_, i = n_input; i--;) {
      *r++ = *p++; /* append to leftovers_ from prev. call */
    }
    int to_pad = fft_size_ - (left_over_ + n_input);
    for (int i = 0; i < to_pad; ++i) {
      *r++ = 0;
    }
    npass = 1;
  } else {
    /* This is the normal non-boundary course of action. */
    for (p = input_buffer_, r = leftovers_ + left_over_,
           i = fft_size_ - left_over_; i--;)
      *r++ = *p++; /* append to leftovers_ from prev. call */
  }
  if (!npass && !(filter_state_ & 2)) {  // it's not the end, but don't
                                       // have enough data for a loop.
    left_over_ += n_input;
    *n_output = 0;
    first_out_ |= filter_state_ & 1;  // flag that start of sig is still here.
    return;
  }
  filter_state_ |= first_out_;
  first_out_ = 0;

  /* >>>>>>>>>>>>>> Here's the main processing loop. <<<<<<<<<<<<< */
  for (/* p set up above */ q = output_delayed_, i = 0; i < npass;
                            i++, q += fft_size_) {
    if (i) {
      for (r = p + fft_size_by2_, j = fft_size_by2_, dp1 = x_, dp2 = y_; j--;) {
        *dp1++ = *p++;
        *dp2++ = *r++;
      }
      p += fft_size_by2_;
    } else {
      for (p2 = leftovers_, r = p2 + fft_size_by2_, j = fft_size_by2_,
             dp1 = x_, dp2 = y_; j--;) {
        *dp1++ = *p2++;
        *dp2++ = *r++;
      }
    }
    for (j = fft_size_by2_; j--;)
      *dp1++ = *dp2++ = 0.0;

    /* Filtering is done in the frequency domain; transform two real arrays. */
    fft_->fft(x_, y_);
    ComplexDotProduct(fft_size_, x_, y_, xf_, NULL, x_, y_);
    fft_->ifft(x_, y_);

    /* Overlap and add. */
    for (dp2 = q, j = fft_size_ - n_filter_coeffs_by2_; j < fft_size_; j++)
      *dp2++ += x_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += x_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = x_[j];

    for (dp2 = q+fft_size_by2_, j = fft_size_ - n_filter_coeffs_by2_;
         j < fft_size_; j++)
      *dp2++ += y_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += y_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = y_[j];
  }    /* end of main processing loop */

  left_over_ = n_input - (p-input_buffer_);
  for (i = left_over_, r = leftovers_; i--;)  // Save unused input
                                              // samples for next call.
    *r++ = *p++;
  /* If signal end is here, must process any unused input. */
  if (left_over_ && (filter_state_ & 2)) {  // Must do one more zero-pad pass.
    for (p2 = leftovers_ + left_over_, i = fft_size_ - left_over_; i--;)
      *p2++ = 0;
    for (p2 = leftovers_, r = p2 + fft_size_by2_, j = fft_size_by2_,
           dp1 = x_, dp2 = y_; j--;) {
      *dp1++ = *p2++;
      *dp2++ = *r++;
    }
    for (j = fft_size_by2_; j--;)
      *dp1++ = *dp2++ = 0.0;
    /* Filtering is done in the frequency domain; transform two real arrays. */
    fft_->fft(x_, y_);
    ComplexDotProduct(fft_size_, x_, y_, xf_, NULL, x_, y_);
    fft_->ifft(x_, y_);

    /* Overlap and add. */
    for (dp2 = q, j = fft_size_ - n_filter_coeffs_by2_; j < fft_size_; j++)
      *dp2++ += x_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += x_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = x_[j];

    for (dp2 = q+fft_size_by2_, j = fft_size_ - n_filter_coeffs_by2_;
         j < fft_size_; j++)
      *dp2++ += y_[j];
    for (j = 0, k = n_filter_coeffs_by2_; j < k; j++)
      *dp2++ += y_[j];
    for (j = n_filter_coeffs_by2_, k = fft_size_ - n_filter_coeffs_by2_;
         j < k; j++)
      *dp2++ = y_[j];
  }
  /* total good output samples in ob: */
  totaln = (((npass * fft_size_) - to_skip_ -
             ((1 & filter_state_)? n_filter_coeffs_by2_ : 0)) +
            ((filter_state_ & 2)? left_over_ + n_filter_coeffs_by2_ : 0));
  /* number returned to caller: */
  *n_output = 1 + (totaln - 1) / decimate_;  // possible decimation for
                                           // downsampling
  /* Round, decimate and output the samples. */
  float f_temp;
  q = (filter_state_ & 1)? output_delayed_ + (n_filter_coeffs_by2_) :
                                output_delayed_ + to_skip_;
  for (j = decimate_, i =  *n_output, p = output_buffer_; i-- ; q += j) {
    if ((f_temp = *q) > 32767.0)
      f_temp = 32767.0;
    if (f_temp < -32768.0)
      f_temp = -32768.0;
    *p++ = static_cast<int16_t>((f_temp > 0.0) ? half + f_temp : f_temp - half);
  }

  for (dp1 = output_delayed_ + npass*fft_size_, j = n_filter_coeffs_,
         dp2 = output_delayed_; j--;) /*save mem for next call */
    *dp2++ = *dp1++;
  /* If decimating, number to skip on next call. */
  to_skip_ = (*n_output * decimate_) - totaln;
}